

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O2

Id dxil_spv::build_index_divider(Impl *impl,Value *offset,uint addr_shift_log2,uint vecsize)

{
  uint64_t uVar1;
  int64_t iVar2;
  Value *value;
  bool bVar3;
  Id IVar4;
  Id type_id;
  Builder *this;
  Operation *pOVar5;
  long lVar6;
  RawBufferAccessSplit local_48;
  
  this = Converter::Impl::builder(impl);
  local_48.scale = 0;
  local_48.bias = 0;
  local_48.dynamic_index = (Value *)0x0;
  bVar3 = extract_raw_buffer_access_split(offset,1,addr_shift_log2,vecsize,&local_48);
  value = local_48.dynamic_index;
  iVar2 = local_48.bias;
  uVar1 = local_48.scale;
  if (bVar3) {
    if (local_48.dynamic_index == (Value *)0x0) {
      IVar4 = spv::Builder::makeUintConstant(this,(uint)local_48.bias,false);
      return IVar4;
    }
    bVar3 = local_48.bias < 1;
    lVar6 = -local_48.bias;
    if (0 < local_48.bias) {
      lVar6 = local_48.bias;
    }
    if (local_48.scale == 1) {
      IVar4 = Converter::Impl::get_id_for_value(impl,local_48.dynamic_index,0);
    }
    else {
      IVar4 = spv::Builder::makeUintType(this,0x20);
      pOVar5 = Converter::Impl::allocate(impl,OpIMul,IVar4);
      IVar4 = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(pOVar5,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,(uint)uVar1,false);
      Operation::add_id(pOVar5,IVar4);
      Converter::Impl::add(impl,pOVar5,false);
      IVar4 = pOVar5->id;
    }
    if (iVar2 == 0) {
      return IVar4;
    }
    type_id = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,(uint)bVar3 * 2 + OpIAdd,type_id);
    Operation::add_id(pOVar5,IVar4);
    addr_shift_log2 = (uint)lVar6;
  }
  else {
    if (vecsize != 1) {
      __assert_fail("vecsize == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_common.cpp"
                    ,0x171,
                    "spv::Id dxil_spv::build_index_divider(Converter::Impl &, const LLVMBC::Value *, unsigned int, unsigned int)"
                   );
    }
    this = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,OpShiftRightLogical,IVar4);
    IVar4 = Converter::Impl::get_id_for_value(impl,offset,0);
    Operation::add_id(pOVar5,IVar4);
  }
  IVar4 = spv::Builder::makeUintConstant(this,addr_shift_log2,false);
  Operation::add_id(pOVar5,IVar4);
  Converter::Impl::add(impl,pOVar5,false);
  return pOVar5->id;
}

Assistant:

spv::Id build_index_divider(Converter::Impl &impl, const llvm::Value *offset,
                            unsigned addr_shift_log2, unsigned vecsize)
{
	auto &builder = impl.builder();
	// Attempt to do trivial constant folding to make output a little more sensible to read.
	// Try to find an expression for offset which is "constant0 * offset + constant1",
	// where constant0 and constant1 are aligned with addr_shift_log2.

	spv::Id index_id;
	RawBufferAccessSplit split = {};

	if (extract_raw_buffer_access_split(offset, 1, addr_shift_log2, vecsize, split))
	{
		if (!split.dynamic_index)
			return builder.makeUintConstant(split.bias);

		spv::Op bias_opcode = split.bias > 0 ? spv::OpIAdd : spv::OpISub;
		if (bias_opcode == spv::OpISub)
			split.bias = -split.bias;

		spv::Id scaled_id;
		if (split.scale != 1)
		{
			Operation *scale_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
			scale_op->add_id(impl.get_id_for_value(split.dynamic_index));
			scale_op->add_id(builder.makeUintConstant(split.scale));
			impl.add(scale_op);
			scaled_id = scale_op->id;
		}
		else
			scaled_id = impl.get_id_for_value(split.dynamic_index);

		spv::Id bias_id;
		if (split.bias != 0)
		{
			Operation *bias_op = impl.allocate(bias_opcode, builder.makeUintType(32));
			bias_op->add_id(scaled_id);
			bias_op->add_id(builder.makeUintConstant(split.bias));
			impl.add(bias_op);
			bias_id = bias_op->id;
		}
		else
			bias_id = scaled_id;

		index_id = bias_id;
	}
	else
	{
		assert(vecsize == 1);
		index_id = build_index_divider_fallback(impl, offset, addr_shift_log2);
	}

	return index_id;
}